

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

void exactinit(int verbose,int noexact,int nofilter,double maxx,double maxy,double maxz)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (verbose != 0) {
    puts("  Initializing robust predicates.");
  }
  test_double(verbose);
  bVar3 = true;
  dVar5 = 1.0;
  dVar4 = 1.0;
  dVar6 = 1.0;
  do {
    dVar4 = dVar4 * 0.5;
    if (bVar3) {
      dVar5 = dVar5 + dVar5;
    }
    dVar7 = dVar4 + 1.0;
    if ((dVar7 == 1.0) && (!NAN(dVar7))) break;
    bVar3 = (bool)(bVar3 ^ 1);
    bVar1 = NAN(dVar6);
    bVar2 = dVar7 != dVar6;
    dVar6 = dVar7;
  } while ((bVar2) || (NAN(dVar7) || bVar1));
  splitter = dVar5 + 1.0;
  resulterrbound = (dVar4 * 8.0 + 3.0) * dVar4;
  ccwerrboundA = (dVar4 * 16.0 + 3.0) * dVar4;
  ccwerrboundB = (dVar4 * 12.0 + 2.0) * dVar4;
  ccwerrboundC = (dVar4 * 64.0 + 9.0) * dVar4 * dVar4;
  o3derrboundA = (dVar4 * 56.0 + 7.0) * dVar4;
  o3derrboundB = (dVar4 * 28.0 + 3.0) * dVar4;
  o3derrboundC = (dVar4 * 288.0 + 26.0) * dVar4 * dVar4;
  iccerrboundA = (dVar4 * 96.0 + 10.0) * dVar4;
  iccerrboundB = (dVar4 * 48.0 + 4.0) * dVar4;
  iccerrboundC = (dVar4 * 576.0 + 44.0) * dVar4 * dVar4;
  isperrboundA = (dVar4 * 224.0 + 16.0) * dVar4;
  isperrboundB = (dVar4 * 72.0 + 5.0) * dVar4;
  isperrboundC = (dVar4 * 1408.0 + 71.0) * dVar4 * dVar4;
  _use_inexact_arith = noexact;
  _use_static_filter = (uint)(nofilter == 0);
  dVar6 = maxz;
  if (maxx <= maxz) {
    dVar6 = maxx;
    maxx = maxz;
  }
  dVar4 = maxy;
  dVar5 = maxx;
  if ((maxx < maxy) || (dVar4 = maxx, dVar5 = maxy, dVar7 = dVar6, dVar6 <= maxy)) {
    maxx = dVar4;
    dVar7 = dVar5;
    maxy = dVar6;
  }
  o3dstaticfilter = maxy * 5.11071278299733e-15 * dVar7 * maxx;
  ispstaticfilter = maxx * maxx * maxy * 1.2466136531027298e-13 * dVar7 * maxx;
  return;
}

Assistant:

void exactinit(int verbose, int noexact, int nofilter, REAL maxx, REAL maxy, 
               REAL maxz)
{
  REAL half;
  REAL check, lastcheck;
  int every_other;
#ifdef LINUX
  int cword;
#endif /* LINUX */

#ifdef CPU86
#ifdef SINGLE
  _control87(_PC_24, _MCW_PC); /* Set FPU control word for single precision. */
#else /* not SINGLE */
  _control87(_PC_53, _MCW_PC); /* Set FPU control word for double precision. */
#endif /* not SINGLE */
#endif /* CPU86 */
#ifdef LINUX
#ifdef SINGLE
  /*  cword = 4223; */
  cword = 4210;                 /* set FPU control word for single precision */
#else /* not SINGLE */
  /*  cword = 4735; */
  cword = 4722;                 /* set FPU control word for double precision */
#endif /* not SINGLE */
  _FPU_SETCW(cword);
#endif /* LINUX */

  if (verbose) {
    printf("  Initializing robust predicates.\n");
  }

#ifdef USE_CGAL_PREDICATES
  if (cgal_pred_obj.Has_static_filters) {
    printf("  Use static filter.\n");
  } else {
    printf("  No static filter.\n");
  }
#endif // USE_CGAL_PREDICATES

#ifdef SINGLE
  test_float(verbose);
#else
  test_double(verbose);
#endif

  every_other = 1;
  half = 0.5;
  epsilon = 1.0;
  splitter = 1.0;
  check = 1.0;
  /* Repeatedly divide `epsilon' by two until it is too small to add to    */
  /*   one without causing roundoff.  (Also check if the sum is equal to   */
  /*   the previous sum, for machines that round up instead of using exact */
  /*   rounding.  Not that this library will work on such machines anyway. */
  do {
    lastcheck = check;
    epsilon *= half;
    if (every_other) {
      splitter *= 2.0;
    }
    every_other = !every_other;
    check = 1.0 + epsilon;
  } while ((check != 1.0) && (check != lastcheck));
  splitter += 1.0;

  /* Error bounds for orientation and incircle tests. */
  resulterrbound = (3.0 + 8.0 * epsilon) * epsilon;
  ccwerrboundA = (3.0 + 16.0 * epsilon) * epsilon;
  ccwerrboundB = (2.0 + 12.0 * epsilon) * epsilon;
  ccwerrboundC = (9.0 + 64.0 * epsilon) * epsilon * epsilon;
  o3derrboundA = (7.0 + 56.0 * epsilon) * epsilon;
  o3derrboundB = (3.0 + 28.0 * epsilon) * epsilon;
  o3derrboundC = (26.0 + 288.0 * epsilon) * epsilon * epsilon;
  iccerrboundA = (10.0 + 96.0 * epsilon) * epsilon;
  iccerrboundB = (4.0 + 48.0 * epsilon) * epsilon;
  iccerrboundC = (44.0 + 576.0 * epsilon) * epsilon * epsilon;
  isperrboundA = (16.0 + 224.0 * epsilon) * epsilon;
  isperrboundB = (5.0 + 72.0 * epsilon) * epsilon;
  isperrboundC = (71.0 + 1408.0 * epsilon) * epsilon * epsilon;

  // Set TetGen options.  Added by H. Si, 2012-08-23.
  _use_inexact_arith = noexact;
  _use_static_filter = !nofilter;

  // Calculate the two static filters for orient3d() and insphere() tests.
  // Added by H. Si, 2012-08-23.

  // Sort maxx < maxy < maxz. Re-use 'half' for swapping.
  if (maxx > maxz) {
    half = maxx; maxx = maxz; maxz = half;
  }
  if (maxy > maxz) {
    half = maxy; maxy = maxz; maxz = half;
  }
  else if (maxy < maxx) {
    half = maxy; maxy = maxx; maxx = half;
  }

  o3dstaticfilter = 5.1107127829973299e-15 * maxx * maxy * maxz;
  ispstaticfilter = 1.2466136531027298e-13 * maxx * maxy * maxz * (maxz * maxz);

}